

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void TestSpanSet(void)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  long lVar6;
  Span *s4;
  Span *s2;
  Span *s1;
  Span *s3;
  SpanSet set;
  Span *local_58;
  Span *local_50;
  Span *local_48;
  Span *local_40;
  _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  local_38;
  
  puts("===================== TestSpanSet BEGIN =====================");
  p_Var3 = &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right = p_Var3;
  local_48 = tcmalloc::FixedAllocator<tcmalloc::Span>::Alloc
                       ((FixedAllocator<tcmalloc::Span> *)tcmalloc::span_allocator);
  local_48->prev = (Span *)0x0;
  local_48->page_id = 4;
  local_48->npages = 2;
  local_48->refcount = 0;
  local_50 = tcmalloc::FixedAllocator<tcmalloc::Span>::Alloc
                       ((FixedAllocator<tcmalloc::Span> *)tcmalloc::span_allocator);
  local_50->prev = (Span *)0x0;
  local_50->page_id = 1;
  local_50->npages = 3;
  local_50->refcount = 0;
  local_40 = tcmalloc::FixedAllocator<tcmalloc::Span>::Alloc
                       ((FixedAllocator<tcmalloc::Span> *)tcmalloc::span_allocator);
  local_40->prev = (Span *)0x0;
  local_40->page_id = 10;
  local_40->npages = 3;
  local_40->refcount = 0;
  local_58 = tcmalloc::FixedAllocator<tcmalloc::Span>::Alloc
                       ((FixedAllocator<tcmalloc::Span> *)tcmalloc::span_allocator);
  local_58->prev = (Span *)0x0;
  local_58->page_id = 0xc;
  local_58->npages = 5;
  local_58->refcount = 0;
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&local_38,&local_48);
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&local_38,&local_50);
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&local_38,&local_40);
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&local_38,&local_58);
  if (local_38._M_impl.super__Rb_tree_header._M_node_count != 4) {
    __assert_fail("set.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x5a,"void TestSpanSet()");
  }
  std::
  _Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
  ::_M_insert_unique<tcmalloc::Span*const&>
            ((_Rb_tree<tcmalloc::Span*,tcmalloc::Span*,std::_Identity<tcmalloc::Span*>,tcmalloc::SpanLessCompare,tcmalloc::STLFixedAllocator<tcmalloc::Span*,0>>
              *)&local_38,&local_48);
  p_Var4 = p_Var3;
  p_Var2 = local_38._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (local_38._M_impl.super__Rb_tree_header._M_node_count != 4) {
    __assert_fail("set.size() == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x5c,"void TestSpanSet()");
  }
  for (; p_Var2 != (_Base_ptr)0x0;
      p_Var2 = *(_Base_ptr *)((long)&((_Rb_tree_node_base *)&p_Var2->_M_color)->_M_color + lVar6)) {
    lVar6 = 0x10;
    uVar1 = *(ulong *)(*(size_t *)(p_Var2 + 1) + 0x18);
    p_Var5 = p_Var2;
    if ((uVar1 < 4) && ((uVar1 != 3 || (*(long *)(*(size_t *)(p_Var2 + 1) + 0x10) == 0)))) {
      lVar6 = 0x18;
      p_Var5 = p_Var4;
    }
    p_Var4 = p_Var5;
  }
  p_Var2 = local_38._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (*(Span **)(p_Var4 + 1) != local_50) {
    __assert_fail("(*(set.upper_bound(&bound))) == s2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x61,"void TestSpanSet()");
  }
  for (; p_Var2 != (_Base_ptr)0x0;
      p_Var2 = *(_Base_ptr *)((long)&((_Rb_tree_node_base *)&p_Var2->_M_color)->_M_color + lVar6)) {
    lVar6 = 0x10;
    uVar1 = *(ulong *)(*(size_t *)(p_Var2 + 1) + 0x18);
    p_Var4 = p_Var2;
    if ((uVar1 < 5) && ((uVar1 != 4 || (*(long *)(*(size_t *)(p_Var2 + 1) + 0x10) == 0)))) {
      lVar6 = 0x18;
      p_Var4 = p_Var3;
    }
    p_Var3 = p_Var4;
  }
  if (*(Span **)(p_Var3 + 1) == local_58) {
    if (tcmalloc::span_allocator[0x18] != '\0') {
      local_48->prev = (Span *)tcmalloc::span_allocator._16_8_;
      local_50->prev = local_48;
      local_40->prev = local_50;
      local_58->prev = local_40;
      tcmalloc::span_allocator._16_8_ = local_58;
      puts("===================== TestSpanSet PASS =====================");
      std::
      _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
      ::~_Rb_tree(&local_38);
      return;
    }
    __assert_fail("inited",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                  ,0x22,
                  "void tcmalloc::FixedAllocator<tcmalloc::Span>::Free(T *) [T = tcmalloc::Span]");
  }
  __assert_fail("(*(set.upper_bound(&bound))) == s4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,100,"void TestSpanSet()");
}

Assistant:

void TestSpanSet() {
    printf("===================== TestSpanSet BEGIN =====================\n");
    tcmalloc::SpanSet set;
    tcmalloc::Span* s1 = tcmalloc::NewSpan(4, 2);
    tcmalloc::Span* s2 = tcmalloc::NewSpan(1, 3);
    tcmalloc::Span* s3 = tcmalloc::NewSpan(10, 3);
    tcmalloc::Span* s4 = tcmalloc::NewSpan(12, 5);

    set.insert(s1);
    set.insert(s2);
    set.insert(s3);
    set.insert(s4);
    assert(set.size() == 4);
    set.insert(s1);
    assert(set.size() == 4);

    tcmalloc::Span bound;
    bound.npages = 3;
    bound.page_id = 0;
    assert((*(set.upper_bound(&bound))) == s2);
    bound.npages = 4;
    bound.page_id = 0;
    assert((*(set.upper_bound(&bound))) == s4);

    tcmalloc::DeleteSpan(s1);
    tcmalloc::DeleteSpan(s2);
    tcmalloc::DeleteSpan(s3);
    tcmalloc::DeleteSpan(s4);
    printf("===================== TestSpanSet PASS =====================\n");
}